

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Matrix * MatrixInvert(Matrix mat)

{
  Matrix *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  float in_stack_00000028;
  float in_stack_0000002c;
  float in_stack_00000030;
  float in_stack_00000034;
  float in_stack_00000038;
  float in_stack_0000003c;
  float in_stack_00000040;
  float in_stack_00000044;
  float fStack_134;
  float fStack_44;
  
  fStack_44 = -in_stack_0000000c;
  fVar5 = in_stack_0000002c * in_stack_00000008 - in_stack_0000000c * in_stack_00000028;
  fVar7 = in_stack_0000001c * in_stack_00000008 - in_stack_0000000c * in_stack_00000018;
  fVar6 = -in_stack_00000038;
  fVar9 = in_stack_00000008 * in_stack_0000003c - in_stack_0000000c * in_stack_00000038;
  fVar14 = in_stack_00000018 * in_stack_0000003c + fVar6 * in_stack_0000001c;
  fVar15 = in_stack_00000018 * in_stack_0000002c + -in_stack_00000028 * in_stack_0000001c;
  fVar8 = in_stack_00000028 * in_stack_0000003c - in_stack_0000002c * in_stack_00000038;
  fVar10 = in_stack_00000034 * in_stack_00000010 - in_stack_00000014 * in_stack_00000030;
  fVar11 = in_stack_00000024 * in_stack_00000010 - in_stack_00000014 * in_stack_00000020;
  fStack_134 = -in_stack_00000014;
  fVar12 = in_stack_00000010 * in_stack_00000044 - in_stack_00000014 * in_stack_00000040;
  fVar13 = -in_stack_00000040;
  fVar1 = in_stack_00000020 * in_stack_00000044 + fVar13 * in_stack_00000024;
  fVar2 = in_stack_00000020 * in_stack_00000034 + -in_stack_00000030 * in_stack_00000024;
  fVar3 = in_stack_00000030 * in_stack_00000044 - in_stack_00000034 * in_stack_00000040;
  fVar4 = 1.0 / (fVar11 * fVar8 +
                ((fVar15 * fVar12 + fVar2 * fVar9 + (fVar7 * fVar3 - fVar1 * fVar5)) -
                fVar14 * fVar10));
  in_RDI->m0 = (in_stack_0000003c * fVar2 + in_stack_0000001c * fVar3 + -in_stack_0000002c * fVar1)
               * fVar4;
  in_RDI->m4 = (-in_stack_0000003c * fVar10 + fStack_44 * fVar3 + in_stack_0000002c * fVar12) *
               fVar4;
  in_RDI->m8 = (in_stack_0000003c * fVar11 + in_stack_0000000c * fVar1 + -in_stack_0000001c * fVar12
               ) * fVar4;
  in_RDI->m12 = (-in_stack_0000002c * fVar11 + fStack_44 * fVar2 + in_stack_0000001c * fVar10) *
                fVar4;
  in_RDI->m1 = (fVar6 * fVar2 + -in_stack_00000018 * fVar3 + in_stack_00000028 * fVar1) * fVar4;
  in_RDI->m5 = (in_stack_00000038 * fVar10 + in_stack_00000008 * fVar3 + -in_stack_00000028 * fVar12
               ) * fVar4;
  in_RDI->m9 = (fVar6 * fVar11 + -in_stack_00000008 * fVar1 + in_stack_00000018 * fVar12) * fVar4;
  in_RDI->m13 = (in_stack_00000028 * fVar11 +
                in_stack_00000008 * fVar2 + -in_stack_00000018 * fVar10) * fVar4;
  in_RDI->m2 = (in_stack_00000044 * fVar15 + in_stack_00000024 * fVar8 + -in_stack_00000034 * fVar14
               ) * fVar4;
  in_RDI->m6 = (-in_stack_00000044 * fVar5 + fStack_134 * fVar8 + in_stack_00000034 * fVar9) * fVar4
  ;
  in_RDI->m10 = (in_stack_00000044 * fVar7 + in_stack_00000014 * fVar14 + -in_stack_00000024 * fVar9
                ) * fVar4;
  in_RDI->m14 = (-in_stack_00000034 * fVar7 + fStack_134 * fVar15 + in_stack_00000024 * fVar5) *
                fVar4;
  in_RDI->m3 = (fVar13 * fVar15 + -in_stack_00000020 * fVar8 + in_stack_00000030 * fVar14) * fVar4;
  in_RDI->m7 = (in_stack_00000040 * fVar5 + in_stack_00000010 * fVar8 + -in_stack_00000030 * fVar9)
               * fVar4;
  in_RDI->m11 = (fVar13 * fVar7 + -in_stack_00000010 * fVar14 + in_stack_00000020 * fVar9) * fVar4;
  in_RDI->m15 = (in_stack_00000030 * fVar7 + in_stack_00000010 * fVar15 + -in_stack_00000020 * fVar5
                ) * fVar4;
  return in_RDI;
}

Assistant:

RMDEF Matrix MatrixInvert(Matrix mat)
{
    Matrix result = { 0 };

    // Cache the matrix values (speed optimization)
    float a00 = mat.m0, a01 = mat.m1, a02 = mat.m2, a03 = mat.m3;
    float a10 = mat.m4, a11 = mat.m5, a12 = mat.m6, a13 = mat.m7;
    float a20 = mat.m8, a21 = mat.m9, a22 = mat.m10, a23 = mat.m11;
    float a30 = mat.m12, a31 = mat.m13, a32 = mat.m14, a33 = mat.m15;

    float b00 = a00*a11 - a01*a10;
    float b01 = a00*a12 - a02*a10;
    float b02 = a00*a13 - a03*a10;
    float b03 = a01*a12 - a02*a11;
    float b04 = a01*a13 - a03*a11;
    float b05 = a02*a13 - a03*a12;
    float b06 = a20*a31 - a21*a30;
    float b07 = a20*a32 - a22*a30;
    float b08 = a20*a33 - a23*a30;
    float b09 = a21*a32 - a22*a31;
    float b10 = a21*a33 - a23*a31;
    float b11 = a22*a33 - a23*a32;

    // Calculate the invert determinant (inlined to avoid double-caching)
    float invDet = 1.0f/(b00*b11 - b01*b10 + b02*b09 + b03*b08 - b04*b07 + b05*b06);

    result.m0 = (a11*b11 - a12*b10 + a13*b09)*invDet;
    result.m1 = (-a01*b11 + a02*b10 - a03*b09)*invDet;
    result.m2 = (a31*b05 - a32*b04 + a33*b03)*invDet;
    result.m3 = (-a21*b05 + a22*b04 - a23*b03)*invDet;
    result.m4 = (-a10*b11 + a12*b08 - a13*b07)*invDet;
    result.m5 = (a00*b11 - a02*b08 + a03*b07)*invDet;
    result.m6 = (-a30*b05 + a32*b02 - a33*b01)*invDet;
    result.m7 = (a20*b05 - a22*b02 + a23*b01)*invDet;
    result.m8 = (a10*b10 - a11*b08 + a13*b06)*invDet;
    result.m9 = (-a00*b10 + a01*b08 - a03*b06)*invDet;
    result.m10 = (a30*b04 - a31*b02 + a33*b00)*invDet;
    result.m11 = (-a20*b04 + a21*b02 - a23*b00)*invDet;
    result.m12 = (-a10*b09 + a11*b07 - a12*b06)*invDet;
    result.m13 = (a00*b09 - a01*b07 + a02*b06)*invDet;
    result.m14 = (-a30*b03 + a31*b01 - a32*b00)*invDet;
    result.m15 = (a20*b03 - a21*b01 + a22*b00)*invDet;

    return result;
}